

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utilities.c
# Opt level: O1

size_t StringUtilities_code_point_length_for_part(wchar_t *string,wchar_t length)

{
  _Bool _Var1;
  wchar_t wVar2;
  size_t sVar3;
  
  wVar2 = L'\0';
  if (length < L'\x01') {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      _Var1 = UnicodeUtilities_is_utf16_surrogate(string[wVar2]);
      wVar2 = (uint)_Var1 + wVar2 + L'\x01';
      sVar3 = sVar3 + 1;
    } while (wVar2 < length);
  }
  return sVar3;
}

Assistant:

size_t StringUtilities_code_point_length_for_part(const wchar_t* string, const int length) {
    int code_points = 0;
    int i;
    for (i = 0; i < length; ++i) {
        ++code_points;
        if (UnicodeUtilities_is_utf16_surrogate(string[i])) {
            ++i;
        }

    }
    return code_points;
}